

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O3

vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderNaive::BlocksInfo
          (vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
           *__return_storage_ptr__,SscReaderNaive *this,Variable<float> *variable,size_t step)

{
  BlocksInfoCommon<float>(__return_storage_ptr__,this,variable,step);
  return __return_storage_ptr__;
}

Assistant:

void SscReaderNaive::GetDeferred(VariableBase &variable, void *data)
{

    if (variable.m_Type == DataType::String)
    {
        auto *variableString = dynamic_cast<Variable<std::string> *>(&variable);
        auto *dataString = reinterpret_cast<std::string *>(data);
        for (const auto &b : m_BlockMap[variable.m_Name])
        {
            if (b.name == variable.m_Name)
            {
                *dataString = std::string(m_Buffer.data() + b.bufferStart,
                                          m_Buffer.data() + b.bufferStart + b.bufferCount);
                variableString->m_Value = *dataString;
                variableString->m_Min = *dataString;
                variableString->m_Max = *dataString;
            }
        }
        return;
    }

    helper::DimsArray vStart(variable.m_Start);
    helper::DimsArray vCount(variable.m_Count);
    helper::DimsArray vMemStart(variable.m_MemoryStart);
    helper::DimsArray vMemCount(variable.m_MemoryCount);

    if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
    {
        std::reverse(vStart.begin(), vStart.end());
        std::reverse(vCount.begin(), vCount.end());
        std::reverse(vMemStart.begin(), vMemStart.end());
        std::reverse(vMemCount.begin(), vMemCount.end());
    }

    for (const auto &b : m_BlockMap[variable.m_Name])
    {
        if (b.shapeId == ShapeID::GlobalArray || b.shapeId == ShapeID::LocalArray)
        {
            helper::NdCopy(m_Buffer.data<char>() + b.bufferStart, helper::CoreDims(b.start),
                           helper::CoreDims(b.count), true, true, reinterpret_cast<char *>(data),
                           vStart, vCount, true, true, static_cast<int>(variable.m_ElementSize),
                           helper::CoreDims(b.start), helper::CoreDims(b.count), vMemStart,
                           vMemCount);
        }
        else if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
        {
            std::memcpy(data, m_Buffer.data() + b.bufferStart, b.bufferCount);
        }
    }
}